

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

int __thiscall io::detail::AsynchronousReader::init(AsynchronousReader *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  type local_38;
  thread local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> guard;
  unique_ptr<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_> *arg_byte_source_local;
  AsynchronousReader *this_local;
  
  guard._8_8_ = ctx;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->lock);
  std::unique_ptr<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>::operator=
            (&this->byte_source,
             (unique_ptr<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_> *)ctx);
  this->desired_byte_count = -1;
  this->termination_requested = false;
  local_38.this = this;
  std::thread::
  thread<io::detail::AsynchronousReader::init(std::unique_ptr<io::ByteSourceBase,std::default_delete<io::ByteSourceBase>>)::_lambda()_1_,,void>
            (&local_30,&local_38);
  std::thread::operator=(&this->worker,&local_30);
  std::thread::~thread(&local_30);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return extraout_EAX;
}

Assistant:

void init(std::unique_ptr<ByteSourceBase>arg_byte_source){
                                std::unique_lock<std::mutex>guard(lock);
                                byte_source = std::move(arg_byte_source);
                                desired_byte_count = -1;
                                termination_requested = false;
                                worker = std::thread(
                                        [&]{
                                                std::unique_lock<std::mutex>guard(lock);
                                                try{
                                                        for(;;){
                                                                read_requested_condition.wait(
                                                                        guard, 
                                                                        [&]{
                                                                                return desired_byte_count != -1 || termination_requested;
                                                                        }
                                                                );
                                                                if(termination_requested)
                                                                        return;

                                                                read_byte_count = byte_source->read(buffer, desired_byte_count);
                                                                desired_byte_count = -1;
                                                                if(read_byte_count == 0)
                                                                        break;
                                                                read_finished_condition.notify_one();
                                                        }
                                                }catch(...){
                                                        read_error = std::current_exception();
                                                }
                                                read_finished_condition.notify_one();
                                        }
                                );
                        }